

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::parseCurrentNode
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  unsigned_short *puVar4;
  long lVar5;
  
  puVar4 = this->P;
  lVar5 = 0;
  while( true ) {
    if (*(short *)((long)puVar4 + lVar5) == 0) {
      return;
    }
    if (*(short *)((long)puVar4 + lVar5) == 0x3c) break;
    this->P = (unsigned_short *)((long)puVar4 + lVar5 + 2);
    lVar5 = lVar5 + 2;
  }
  if ((0 < lVar5) && (bVar3 = setText(this,puVar4,(unsigned_short *)(lVar5 + (long)puVar4)), bVar3))
  {
    return;
  }
  puVar4 = this->P;
  this->P = puVar4 + 1;
  uVar1 = puVar4[1];
  if (uVar1 == 0x21) {
    bVar3 = parseCDATA(this);
    if (bVar3) {
      return;
    }
    parseComment(this);
    return;
  }
  if (uVar1 == 0x3f) {
    this->CurrentNodeType = EXN_UNKNOWN;
    if (puVar4[1] != 0x3e) {
      puVar2 = puVar4 + 2;
      do {
        puVar4 = puVar2;
        this->P = puVar4;
        puVar2 = puVar4 + 1;
      } while (*puVar4 != 0x3e);
      puVar4 = puVar4 + -1;
    }
    this->P = puVar4 + 2;
    return;
  }
  if (uVar1 != 0x2f) {
    parseOpeningXMLElement(this);
    return;
  }
  parseClosingXMLElement(this);
  return;
}

Assistant:

void parseCurrentNode()
	{
		char_type* start = P;

		// move forward until '<' found
		while(*P != L'<' && *P)
			++P;

		if (!*P)
			return;

		if (P - start > 0)
		{
			// we found some text, store it
			if (setText(start, P))
				return;
		}

		++P;

		// based on current token, parse and report next element
		switch(*P)
		{
		case L'/':
			parseClosingXMLElement(); 
			break;
		case L'?':
			ignoreDefinition();	
			break;
		case L'!':
			if (!parseCDATA())
				parseComment();	
			break;
		default:
			parseOpeningXMLElement();
			break;
		}
	}